

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O3

bool __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::getRedCostViolation
          (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *maxviol,
          number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *sumviol)

{
  undefined8 *puVar1;
  uint *puVar2;
  bool bVar3;
  byte bVar4;
  uint uVar5;
  pointer pnVar6;
  undefined8 uVar7;
  bool bVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  VarStatus VVar15;
  int iVar16;
  ulong uVar17;
  long lVar18;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<100U,_int,_void> local_98;
  cpp_dec_float<100U,_int,_void> *local_40;
  uint *local_38;
  
  bVar3 = this->_hasBasis;
  if (bVar3 == true) {
    local_40 = &sumviol->m_backend;
    if ((this->_hasSolRational == true) && (this->_hasSolReal == false)) {
      SolBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
      ::operator=((SolBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                   *)&this->_solReal,&this->_solRational);
      this->_hasSolReal = true;
    }
    boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
              ((cpp_dec_float<100u,int,void> *)maxviol,0.0);
    boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
              ((cpp_dec_float<100u,int,void> *)local_40,0.0);
    uVar17 = (ulong)(this->_realLP->
                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .set.thenum;
    if (0 < (long)uVar17) {
      local_38 = (maxviol->m_backend).data._M_elems + 1;
      lVar18 = uVar17 * 0x50;
      do {
        VVar15 = basisColStatus(this,(int)(uVar17 - 1));
        if (this->_currentSettings->_intParamValues[0] == -1) {
          if (((VVar15 & ~FIXED) != ON_UPPER) &&
             (pnVar6 = (this->_solReal)._redCost.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
             *(int *)((long)&(pnVar6->m_backend).data + lVar18 + -8) != 2)) {
            local_98.fpclass = cpp_dec_float_finite;
            local_98.prec_elem = 0x10;
            local_98.data._M_elems[0] = 0;
            local_98.data._M_elems[1] = 0;
            local_98.data._M_elems[2] = 0;
            local_98.data._M_elems[3] = 0;
            local_98.data._M_elems[4] = 0;
            local_98.data._M_elems[5] = 0;
            local_98.data._M_elems[6] = 0;
            local_98.data._M_elems[7] = 0;
            local_98.data._M_elems[8] = 0;
            local_98.data._M_elems[9] = 0;
            local_98.data._M_elems[10] = 0;
            local_98.data._M_elems[0xb] = 0;
            local_98.data._M_elems[0xc] = 0;
            local_98.data._M_elems[0xd] = 0;
            local_98.data._M_elems[0xe] = 0;
            local_98.data._M_elems[0xf] = 0;
            local_98.exp = 0;
            local_98.neg = false;
            boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                      ((cpp_dec_float<100u,int,void> *)&local_98,0.0);
            iVar16 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                               ((cpp_dec_float<100U,_int,_void> *)
                                ((long)&pnVar6[-1].m_backend.data + lVar18),&local_98);
            if (iVar16 < 0) {
              pnVar6 = (this->_solReal)._redCost.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              puVar2 = (uint *)((long)&pnVar6[-1].m_backend.data + lVar18);
              local_98.data._M_elems._0_8_ = *(undefined8 *)puVar2;
              local_98.data._M_elems._8_8_ = *(undefined8 *)(puVar2 + 2);
              puVar2 = (uint *)((long)&(pnVar6->m_backend).data + lVar18 + -0x40);
              local_98.data._M_elems._16_8_ = *(undefined8 *)puVar2;
              local_98.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
              puVar2 = (uint *)((long)&(pnVar6->m_backend).data + lVar18 + -0x30);
              local_98.data._M_elems._32_8_ = *(undefined8 *)puVar2;
              uVar7 = *(undefined8 *)(puVar2 + 2);
              puVar1 = (undefined8 *)((long)&(pnVar6->m_backend).data + lVar18 + -0x20);
              uVar9 = *puVar1;
              uVar10 = puVar1[1];
              local_98.data._M_elems[0xc] = (uint)uVar9;
              local_98.data._M_elems[0xd] = (uint)((ulong)uVar9 >> 0x20);
              local_98.data._M_elems[0xe] = (uint)uVar10;
              local_98.data._M_elems[0xf] = (uint)((ulong)uVar10 >> 0x20);
              local_98.data._M_elems[10] = (uint)uVar7;
              local_98.data._M_elems[0xb] = (uint)((ulong)uVar7 >> 0x20);
              local_98.exp = *(int *)((long)&(pnVar6->m_backend).data + lVar18 + -0x10);
              local_98.neg = *(bool *)((long)&(pnVar6->m_backend).data + lVar18 + -0xc);
              local_98._72_8_ = *(undefined8 *)((long)&(pnVar6->m_backend).data + lVar18 + -8);
              if (local_98.fpclass != cpp_dec_float_finite || local_98.data._M_elems[0] != 0) {
                local_98.neg = (bool)(local_98.neg ^ 1);
              }
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                        (local_40,&local_98);
              pnVar6 = (this->_solReal)._redCost.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              local_98.data._M_elems._0_8_ = *(undefined8 *)(maxviol->m_backend).data._M_elems;
              local_98.data._M_elems._8_8_ = *(undefined8 *)((maxviol->m_backend).data._M_elems + 2)
              ;
              local_98.data._M_elems._16_8_ =
                   *(undefined8 *)((maxviol->m_backend).data._M_elems + 4);
              local_98.data._M_elems._24_8_ =
                   *(undefined8 *)((maxviol->m_backend).data._M_elems + 6);
              local_98.data._M_elems._32_8_ =
                   *(undefined8 *)((maxviol->m_backend).data._M_elems + 8);
              uVar7 = *(undefined8 *)((maxviol->m_backend).data._M_elems + 10);
              uVar9 = *(undefined8 *)((maxviol->m_backend).data._M_elems + 0xc);
              uVar10 = *(undefined8 *)((maxviol->m_backend).data._M_elems + 0xe);
              local_98.data._M_elems[0xc] = (uint)uVar9;
              local_98.data._M_elems[0xd] = (uint)((ulong)uVar9 >> 0x20);
              local_98.data._M_elems[0xe] = (uint)uVar10;
              local_98.data._M_elems[0xf] = (uint)((ulong)uVar10 >> 0x20);
              local_98.data._M_elems[10] = (uint)uVar7;
              local_98.data._M_elems[0xb] = (uint)((ulong)uVar7 >> 0x20);
              local_98.exp = (maxviol->m_backend).exp;
              local_98.neg = (maxviol->m_backend).neg;
              local_98.fpclass = (maxviol->m_backend).fpclass;
              local_98.prec_elem = (maxviol->m_backend).prec_elem;
              if (local_98.data._M_elems[0] != 0 || local_98.fpclass != cpp_dec_float_finite) {
                local_98.neg = (bool)(local_98.neg ^ 1);
              }
              if (((local_98.fpclass != cpp_dec_float_NaN) &&
                  (*(int *)((long)&(pnVar6->m_backend).data + lVar18 + -8) != 2)) &&
                 (iVar16 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                     ((cpp_dec_float<100U,_int,_void> *)
                                      ((long)&pnVar6[-1].m_backend.data + lVar18),&local_98),
                 iVar16 < 0)) {
                pnVar6 = (this->_solReal)._redCost.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                uVar5 = *(uint *)((long)&pnVar6[-1].m_backend.data + lVar18);
                puVar1 = (undefined8 *)((long)&(pnVar6->m_backend).data + lVar18 + -0x20);
                uVar9 = puVar1[1];
                local_98.data._M_elems[0xc] = (uint)((ulong)*puVar1 >> 0x20);
                local_98.data._M_elems[0xd] = (uint)uVar9;
                local_98.data._M_elems[0xe] = (uint)((ulong)uVar9 >> 0x20);
                puVar2 = (uint *)((long)&(pnVar6->m_backend).data + lVar18 + -0x2c);
                local_98.data._M_elems._32_8_ = *(undefined8 *)puVar2;
                uVar10 = *(undefined8 *)(puVar2 + 2);
                local_98.data._M_elems[10] = (uint)uVar10;
                local_98.data._M_elems[0xb] = (uint)((ulong)uVar10 >> 0x20);
                puVar2 = (uint *)((long)&(pnVar6->m_backend).data + lVar18 + -0x3c);
                local_98.data._M_elems._16_8_ = *(undefined8 *)puVar2;
                local_98.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
                puVar2 = (uint *)((long)&(pnVar6->m_backend).data + lVar18 + -0x4c);
                local_98.data._M_elems._0_8_ = *(undefined8 *)puVar2;
                local_98.data._M_elems._8_8_ = *(undefined8 *)(puVar2 + 2);
                iVar16 = *(int *)((long)&(pnVar6->m_backend).data + lVar18 + -0x10);
                uVar7 = *(undefined8 *)((long)&(pnVar6->m_backend).data + lVar18 + -8);
                bVar4 = *(byte *)((long)&(pnVar6->m_backend).data + lVar18 + -0xc);
                (maxviol->m_backend).data._M_elems[0] = uVar5;
                *(ulong *)(local_38 + 0xb) =
                     CONCAT44(local_98.data._M_elems[0xc],local_98.data._M_elems[0xb]);
                *(undefined8 *)(local_38 + 0xd) = uVar9;
                *(undefined8 *)(local_38 + 8) = local_98.data._M_elems._32_8_;
                *(undefined8 *)(local_38 + 10) = uVar10;
                *(undefined8 *)(local_38 + 4) = local_98.data._M_elems._16_8_;
                *(undefined8 *)(local_38 + 6) = local_98.data._M_elems._24_8_;
                *(undefined8 *)local_38 = local_98.data._M_elems._0_8_;
                *(undefined8 *)(local_38 + 2) = local_98.data._M_elems._8_8_;
                (maxviol->m_backend).exp = iVar16;
                (maxviol->m_backend).neg = (bool)((uVar5 != 0 || (int)uVar7 != 0) ^ bVar4);
                (maxviol->m_backend).fpclass = (int)uVar7;
                (maxviol->m_backend).prec_elem = (int)((ulong)uVar7 >> 0x20);
              }
            }
          }
          if ((VVar15 - ZERO < 0xfffffffe) &&
             (pnVar6 = (this->_solReal)._redCost.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
             *(int *)((long)&(pnVar6->m_backend).data + lVar18 + -8) != 2)) {
            local_98.fpclass = cpp_dec_float_finite;
            local_98.prec_elem = 0x10;
            local_98.data._M_elems[0] = 0;
            local_98.data._M_elems[1] = 0;
            local_98.data._M_elems[2] = 0;
            local_98.data._M_elems[3] = 0;
            local_98.data._M_elems[4] = 0;
            local_98.data._M_elems[5] = 0;
            local_98.data._M_elems[6] = 0;
            local_98.data._M_elems[7] = 0;
            local_98.data._M_elems[8] = 0;
            local_98.data._M_elems[9] = 0;
            local_98.data._M_elems[10] = 0;
            local_98.data._M_elems[0xb] = 0;
            local_98.data._M_elems[0xc] = 0;
            local_98.data._M_elems[0xd] = 0;
            local_98.data._M_elems[0xe] = 0;
            local_98.data._M_elems[0xf] = 0;
            local_98.exp = 0;
            local_98.neg = false;
            boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                      ((cpp_dec_float<100u,int,void> *)&local_98,0.0);
            iVar16 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                               ((cpp_dec_float<100U,_int,_void> *)
                                ((long)&pnVar6[-1].m_backend.data + lVar18),&local_98);
            if (0 < iVar16) {
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                        (local_40,(cpp_dec_float<100U,_int,_void> *)
                                  ((long)&(this->_solReal)._redCost.val.
                                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.
                                          data + lVar18));
              pnVar6 = (this->_solReal)._redCost.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              if (((*(int *)((long)&(pnVar6->m_backend).data + lVar18 + -8) != 2) &&
                  ((maxviol->m_backend).fpclass != cpp_dec_float_NaN)) &&
                 (iVar16 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                     ((cpp_dec_float<100U,_int,_void> *)
                                      ((long)&pnVar6[-1].m_backend.data + lVar18),
                                      &maxviol->m_backend), 0 < iVar16)) {
                pnVar6 = (this->_solReal)._redCost.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                puVar1 = (undefined8 *)((long)&pnVar6[-1].m_backend.data + lVar18);
                uVar7 = *puVar1;
                uVar9 = puVar1[1];
                puVar1 = (undefined8 *)((long)&(pnVar6->m_backend).data + lVar18 + -0x40);
                uVar10 = *puVar1;
                uVar11 = puVar1[1];
                puVar1 = (undefined8 *)((long)&(pnVar6->m_backend).data + lVar18 + -0x30);
                uVar12 = *puVar1;
                uVar13 = puVar1[1];
                puVar1 = (undefined8 *)((long)&(pnVar6->m_backend).data + lVar18 + -0x20);
                uVar14 = puVar1[1];
                *(undefined8 *)((maxviol->m_backend).data._M_elems + 0xc) = *puVar1;
                *(undefined8 *)((maxviol->m_backend).data._M_elems + 0xe) = uVar14;
                *(undefined8 *)((maxviol->m_backend).data._M_elems + 8) = uVar12;
                *(undefined8 *)((maxviol->m_backend).data._M_elems + 10) = uVar13;
                *(undefined8 *)((maxviol->m_backend).data._M_elems + 4) = uVar10;
                *(undefined8 *)((maxviol->m_backend).data._M_elems + 6) = uVar11;
                *(undefined8 *)(maxviol->m_backend).data._M_elems = uVar7;
                *(undefined8 *)((maxviol->m_backend).data._M_elems + 2) = uVar9;
                (maxviol->m_backend).exp =
                     *(int *)((long)&(pnVar6->m_backend).data + lVar18 + -0x10);
                (maxviol->m_backend).neg =
                     *(bool *)((long)&(pnVar6->m_backend).data + lVar18 + -0xc);
                uVar7 = *(undefined8 *)((long)&(pnVar6->m_backend).data + lVar18 + -8);
                (maxviol->m_backend).fpclass = (int)uVar7;
                (maxviol->m_backend).prec_elem = (int)((ulong)uVar7 >> 0x20);
              }
            }
          }
        }
        else {
          if (((VVar15 & ~FIXED) != ON_UPPER) &&
             (pnVar6 = (this->_solReal)._redCost.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
             *(int *)((long)&(pnVar6->m_backend).data + lVar18 + -8) != 2)) {
            local_98.fpclass = cpp_dec_float_finite;
            local_98.prec_elem = 0x10;
            local_98.data._M_elems[0] = 0;
            local_98.data._M_elems[1] = 0;
            local_98.data._M_elems[2] = 0;
            local_98.data._M_elems[3] = 0;
            local_98.data._M_elems[4] = 0;
            local_98.data._M_elems[5] = 0;
            local_98.data._M_elems[6] = 0;
            local_98.data._M_elems[7] = 0;
            local_98.data._M_elems[8] = 0;
            local_98.data._M_elems[9] = 0;
            local_98.data._M_elems[10] = 0;
            local_98.data._M_elems[0xb] = 0;
            local_98.data._M_elems[0xc] = 0;
            local_98.data._M_elems[0xd] = 0;
            local_98.data._M_elems[0xe] = 0;
            local_98.data._M_elems[0xf] = 0;
            local_98.exp = 0;
            local_98.neg = false;
            boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                      ((cpp_dec_float<100u,int,void> *)&local_98,0.0);
            iVar16 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                               ((cpp_dec_float<100U,_int,_void> *)
                                ((long)&pnVar6[-1].m_backend.data + lVar18),&local_98);
            if (0 < iVar16) {
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                        (local_40,(cpp_dec_float<100U,_int,_void> *)
                                  ((long)&(this->_solReal)._redCost.val.
                                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.
                                          data + lVar18));
              pnVar6 = (this->_solReal)._redCost.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              if (((*(int *)((long)&(pnVar6->m_backend).data + lVar18 + -8) != 2) &&
                  ((maxviol->m_backend).fpclass != cpp_dec_float_NaN)) &&
                 (iVar16 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                     ((cpp_dec_float<100U,_int,_void> *)
                                      ((long)&pnVar6[-1].m_backend.data + lVar18),
                                      &maxviol->m_backend), 0 < iVar16)) {
                pnVar6 = (this->_solReal)._redCost.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                puVar1 = (undefined8 *)((long)&pnVar6[-1].m_backend.data + lVar18);
                uVar7 = *puVar1;
                uVar9 = puVar1[1];
                puVar1 = (undefined8 *)((long)&(pnVar6->m_backend).data + lVar18 + -0x40);
                uVar10 = *puVar1;
                uVar11 = puVar1[1];
                puVar1 = (undefined8 *)((long)&(pnVar6->m_backend).data + lVar18 + -0x30);
                uVar12 = *puVar1;
                uVar13 = puVar1[1];
                puVar1 = (undefined8 *)((long)&(pnVar6->m_backend).data + lVar18 + -0x20);
                uVar14 = puVar1[1];
                *(undefined8 *)((maxviol->m_backend).data._M_elems + 0xc) = *puVar1;
                *(undefined8 *)((maxviol->m_backend).data._M_elems + 0xe) = uVar14;
                *(undefined8 *)((maxviol->m_backend).data._M_elems + 8) = uVar12;
                *(undefined8 *)((maxviol->m_backend).data._M_elems + 10) = uVar13;
                *(undefined8 *)((maxviol->m_backend).data._M_elems + 4) = uVar10;
                *(undefined8 *)((maxviol->m_backend).data._M_elems + 6) = uVar11;
                *(undefined8 *)(maxviol->m_backend).data._M_elems = uVar7;
                *(undefined8 *)((maxviol->m_backend).data._M_elems + 2) = uVar9;
                (maxviol->m_backend).exp =
                     *(int *)((long)&(pnVar6->m_backend).data + lVar18 + -0x10);
                (maxviol->m_backend).neg =
                     *(bool *)((long)&(pnVar6->m_backend).data + lVar18 + -0xc);
                uVar7 = *(undefined8 *)((long)&(pnVar6->m_backend).data + lVar18 + -8);
                (maxviol->m_backend).fpclass = (int)uVar7;
                (maxviol->m_backend).prec_elem = (int)((ulong)uVar7 >> 0x20);
              }
            }
          }
          if ((VVar15 - ZERO < 0xfffffffe) &&
             (pnVar6 = (this->_solReal)._redCost.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
             *(int *)((long)&(pnVar6->m_backend).data + lVar18 + -8) != 2)) {
            local_98.fpclass = cpp_dec_float_finite;
            local_98.prec_elem = 0x10;
            local_98.data._M_elems[0] = 0;
            local_98.data._M_elems[1] = 0;
            local_98.data._M_elems[2] = 0;
            local_98.data._M_elems[3] = 0;
            local_98.data._M_elems[4] = 0;
            local_98.data._M_elems[5] = 0;
            local_98.data._M_elems[6] = 0;
            local_98.data._M_elems[7] = 0;
            local_98.data._M_elems[8] = 0;
            local_98.data._M_elems[9] = 0;
            local_98.data._M_elems[10] = 0;
            local_98.data._M_elems[0xb] = 0;
            local_98.data._M_elems[0xc] = 0;
            local_98.data._M_elems[0xd] = 0;
            local_98.data._M_elems[0xe] = 0;
            local_98.data._M_elems[0xf] = 0;
            local_98.exp = 0;
            local_98.neg = false;
            boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                      ((cpp_dec_float<100u,int,void> *)&local_98,0.0);
            iVar16 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                               ((cpp_dec_float<100U,_int,_void> *)
                                ((long)&pnVar6[-1].m_backend.data + lVar18),&local_98);
            if (iVar16 < 0) {
              pnVar6 = (this->_solReal)._redCost.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              puVar2 = (uint *)((long)&pnVar6[-1].m_backend.data + lVar18);
              local_98.data._M_elems._0_8_ = *(undefined8 *)puVar2;
              local_98.data._M_elems._8_8_ = *(undefined8 *)(puVar2 + 2);
              puVar2 = (uint *)((long)&(pnVar6->m_backend).data + lVar18 + -0x40);
              local_98.data._M_elems._16_8_ = *(undefined8 *)puVar2;
              local_98.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
              puVar2 = (uint *)((long)&(pnVar6->m_backend).data + lVar18 + -0x30);
              local_98.data._M_elems._32_8_ = *(undefined8 *)puVar2;
              uVar7 = *(undefined8 *)(puVar2 + 2);
              puVar1 = (undefined8 *)((long)&(pnVar6->m_backend).data + lVar18 + -0x20);
              uVar9 = *puVar1;
              uVar10 = puVar1[1];
              local_98.data._M_elems[0xc] = (uint)uVar9;
              local_98.data._M_elems[0xd] = (uint)((ulong)uVar9 >> 0x20);
              local_98.data._M_elems[0xe] = (uint)uVar10;
              local_98.data._M_elems[0xf] = (uint)((ulong)uVar10 >> 0x20);
              local_98.data._M_elems[10] = (uint)uVar7;
              local_98.data._M_elems[0xb] = (uint)((ulong)uVar7 >> 0x20);
              local_98.exp = *(int *)((long)&(pnVar6->m_backend).data + lVar18 + -0x10);
              local_98.neg = *(bool *)((long)&(pnVar6->m_backend).data + lVar18 + -0xc);
              local_98._72_8_ = *(undefined8 *)((long)&(pnVar6->m_backend).data + lVar18 + -8);
              if (local_98.fpclass != cpp_dec_float_finite || local_98.data._M_elems[0] != 0) {
                local_98.neg = (bool)(local_98.neg ^ 1);
              }
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                        (local_40,&local_98);
              pnVar6 = (this->_solReal)._redCost.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              local_98.data._M_elems._0_8_ = *(undefined8 *)(maxviol->m_backend).data._M_elems;
              local_98.data._M_elems._8_8_ = *(undefined8 *)((maxviol->m_backend).data._M_elems + 2)
              ;
              local_98.data._M_elems._16_8_ =
                   *(undefined8 *)((maxviol->m_backend).data._M_elems + 4);
              local_98.data._M_elems._24_8_ =
                   *(undefined8 *)((maxviol->m_backend).data._M_elems + 6);
              local_98.data._M_elems._32_8_ =
                   *(undefined8 *)((maxviol->m_backend).data._M_elems + 8);
              uVar7 = *(undefined8 *)((maxviol->m_backend).data._M_elems + 10);
              uVar9 = *(undefined8 *)((maxviol->m_backend).data._M_elems + 0xc);
              uVar10 = *(undefined8 *)((maxviol->m_backend).data._M_elems + 0xe);
              local_98.data._M_elems[0xc] = (uint)uVar9;
              local_98.data._M_elems[0xd] = (uint)((ulong)uVar9 >> 0x20);
              local_98.data._M_elems[0xe] = (uint)uVar10;
              local_98.data._M_elems[0xf] = (uint)((ulong)uVar10 >> 0x20);
              local_98.data._M_elems[10] = (uint)uVar7;
              local_98.data._M_elems[0xb] = (uint)((ulong)uVar7 >> 0x20);
              local_98.exp = (maxviol->m_backend).exp;
              local_98.neg = (maxviol->m_backend).neg;
              local_98.fpclass = (maxviol->m_backend).fpclass;
              local_98.prec_elem = (maxviol->m_backend).prec_elem;
              if (local_98.data._M_elems[0] != 0 || local_98.fpclass != cpp_dec_float_finite) {
                local_98.neg = (bool)(local_98.neg ^ 1);
              }
              if (((local_98.fpclass != cpp_dec_float_NaN) &&
                  (*(int *)((long)&(pnVar6->m_backend).data + lVar18 + -8) != 2)) &&
                 (iVar16 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                     ((cpp_dec_float<100U,_int,_void> *)
                                      ((long)&pnVar6[-1].m_backend.data + lVar18),&local_98),
                 iVar16 < 0)) {
                pnVar6 = (this->_solReal)._redCost.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                uVar5 = *(uint *)((long)&pnVar6[-1].m_backend.data + lVar18);
                puVar1 = (undefined8 *)((long)&(pnVar6->m_backend).data + lVar18 + -0x20);
                uVar9 = puVar1[1];
                local_98.data._M_elems[0xc] = (uint)((ulong)*puVar1 >> 0x20);
                local_98.data._M_elems[0xd] = (uint)uVar9;
                local_98.data._M_elems[0xe] = (uint)((ulong)uVar9 >> 0x20);
                puVar2 = (uint *)((long)&(pnVar6->m_backend).data + lVar18 + -0x2c);
                local_98.data._M_elems._32_8_ = *(undefined8 *)puVar2;
                uVar10 = *(undefined8 *)(puVar2 + 2);
                local_98.data._M_elems[10] = (uint)uVar10;
                local_98.data._M_elems[0xb] = (uint)((ulong)uVar10 >> 0x20);
                puVar2 = (uint *)((long)&(pnVar6->m_backend).data + lVar18 + -0x3c);
                local_98.data._M_elems._16_8_ = *(undefined8 *)puVar2;
                local_98.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
                puVar2 = (uint *)((long)&(pnVar6->m_backend).data + lVar18 + -0x4c);
                local_98.data._M_elems._0_8_ = *(undefined8 *)puVar2;
                local_98.data._M_elems._8_8_ = *(undefined8 *)(puVar2 + 2);
                iVar16 = *(int *)((long)&(pnVar6->m_backend).data + lVar18 + -0x10);
                uVar7 = *(undefined8 *)((long)&(pnVar6->m_backend).data + lVar18 + -8);
                bVar4 = *(byte *)((long)&(pnVar6->m_backend).data + lVar18 + -0xc);
                (maxviol->m_backend).data._M_elems[0] = uVar5;
                *(ulong *)(local_38 + 0xb) =
                     CONCAT44(local_98.data._M_elems[0xc],local_98.data._M_elems[0xb]);
                *(undefined8 *)(local_38 + 0xd) = uVar9;
                *(undefined8 *)(local_38 + 8) = local_98.data._M_elems._32_8_;
                *(undefined8 *)(local_38 + 10) = uVar10;
                *(undefined8 *)(local_38 + 4) = local_98.data._M_elems._16_8_;
                *(undefined8 *)(local_38 + 6) = local_98.data._M_elems._24_8_;
                *(undefined8 *)local_38 = local_98.data._M_elems._0_8_;
                *(undefined8 *)(local_38 + 2) = local_98.data._M_elems._8_8_;
                (maxviol->m_backend).exp = iVar16;
                (maxviol->m_backend).neg = (bool)((uVar5 != 0 || (int)uVar7 != 0) ^ bVar4);
                (maxviol->m_backend).fpclass = (int)uVar7;
                (maxviol->m_backend).prec_elem = (int)((ulong)uVar7 >> 0x20);
              }
            }
          }
        }
        lVar18 = lVar18 + -0x50;
        bVar8 = 1 < uVar17;
        uVar17 = uVar17 - 1;
      } while (bVar8);
    }
  }
  return bVar3;
}

Assistant:

bool SoPlexBase<R>::getRedCostViolation(R& maxviol, R& sumviol)
{
   if(!hasBasis())
      return false;

   _syncRealSolution();
   VectorBase<R>& redcost = _solReal._redCost;
   assert(redcost.dim() == numCols());

   maxviol = 0.0;
   sumviol = 0.0;

   for(int c = numCols() - 1; c >= 0; c--)
   {
      typename SPxSolverBase<R>::VarStatus colStatus = basisColStatus(c);

      if(intParam(SoPlexBase<R>::OBJSENSE) == OBJSENSE_MINIMIZE)
      {
         if(colStatus != SPxSolverBase<R>::ON_UPPER && colStatus != SPxSolverBase<R>::FIXED
               && redcost[c] < 0.0)
         {
            sumviol += -redcost[c];

            if(redcost[c] < -maxviol)
               maxviol = -redcost[c];
         }

         if(colStatus != SPxSolverBase<R>::ON_LOWER && colStatus != SPxSolverBase<R>::FIXED
               && redcost[c] > 0.0)
         {
            sumviol += redcost[c];

            if(redcost[c] > maxviol)
               maxviol = redcost[c];
         }
      }
      else
      {
         if(colStatus != SPxSolverBase<R>::ON_UPPER && colStatus != SPxSolverBase<R>::FIXED
               && redcost[c] > 0.0)
         {
            sumviol += redcost[c];

            if(redcost[c] > maxviol)
               maxviol = redcost[c];
         }

         if(colStatus != SPxSolverBase<R>::ON_LOWER && colStatus != SPxSolverBase<R>::FIXED
               && redcost[c] < 0.0)
         {
            sumviol += -redcost[c];

            if(redcost[c] < -maxviol)
               maxviol = -redcost[c];
         }
      }
   }

   return true;
}